

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O2

void __thiscall r_code::Code::load(Code *this,SysObject *source)

{
  int iVar1;
  Atom *pAVar2;
  undefined4 extraout_var;
  ulong uVar3;
  
  for (uVar3 = 0; uVar3 = uVar3 & 0xffff,
      uVar3 < (ulong)(*(long *)(source + 0x10) - *(long *)(source + 8) >> 2);
      uVar3 = (ulong)((int)uVar3 + 1)) {
    pAVar2 = vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(source + 8),uVar3);
    iVar1 = (*(this->super__Object)._vptr__Object[4])(this,uVar3);
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),pAVar2);
  }
  (*(this->super__Object)._vptr__Object[3])(this,(ulong)*(uint *)(source + 0x68));
  return;
}

Assistant:

void load(SysObject *source)
    {
        for (uint16_t i = 0; i < source->code.size(); ++i) {
            code(i) = source->code[i];
        }

        set_oid(source->oid);
    }